

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

Result<vkb::SystemInfo> * vkb::SystemInfo::get_system_info(void)

{
  bool bVar1;
  VulkanFunctions *this;
  Result<vkb::SystemInfo> *in_RDI;
  error_code eVar2;
  SystemInfo local_58;
  uint local_20;
  error_category *local_18;
  
  this = detail::vulkan_functions();
  bVar1 = detail::VulkanFunctions::init_vulkan_funcs(this,(PFN_vkGetInstanceProcAddr)0x0);
  if (bVar1) {
    SystemInfo(&local_58);
    Result<vkb::SystemInfo>::Result(in_RDI,&local_58);
    ~SystemInfo(&local_58);
  }
  else {
    eVar2 = make_error_code(vulkan_unavailable);
    local_20 = eVar2._M_value;
    eVar2._4_4_ = 0;
    eVar2._M_value = local_20;
    local_18 = eVar2._M_cat;
    Result<vkb::SystemInfo>::Result(in_RDI,eVar2,VK_SUCCESS);
  }
  return in_RDI;
}

Assistant:

Result<SystemInfo> SystemInfo::get_system_info() {
    if (!detail::vulkan_functions().init_vulkan_funcs(nullptr)) {
        return make_error_code(InstanceError::vulkan_unavailable);
    }
    return SystemInfo();
}